

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  int v1;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Nullable<const_char_*> failure_msg;
  LimitToken old;
  LimitToken local_30;
  LimitToken local_2c;
  LogMessageFatal local_28;
  
  pcVar2 = ReadSizeAndPushLimitAndDepth(this,ptr,&local_30);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    v1 = this->depth_;
    pcVar3 = MessageLite::_InternalParse(msg,pcVar2,this);
    if ((pcVar3 != (char *)0x0) &&
       (failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                (v1,this->depth_,"old_depth == depth_"),
       failure_msg != (Nullable<const_char_*>)0x0)) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0x1bf,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
    }
    this->depth_ = this->depth_ + 1;
    local_2c.token_ = local_30.token_;
    bVar1 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,&local_2c);
    pcVar2 = (char *)0x0;
    if (bVar1) {
      pcVar2 = pcVar3;
    }
  }
  return pcVar2;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  LimitToken old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  if (ptr == nullptr) return ptr;
  auto old_depth = depth_;
  ptr = msg->_InternalParse(ptr, this);
  if (ptr != nullptr) ABSL_DCHECK_EQ(old_depth, depth_);
  depth_++;
  if (!PopLimit(std::move(old))) return nullptr;
  return ptr;
}